

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_privkey_tweak_inv(secp256k1_context *ctx,uchar *seckey)

{
  uint uVar1;
  uchar *in_RSI;
  int overflow;
  int ret;
  secp256k1_scalar inv;
  secp256k1_scalar sec;
  secp256k1_scalar *in_stack_00000168;
  secp256k1_scalar *in_stack_00000170;
  char *in_stack_ffffffffffffff98;
  int iVar2;
  uchar *in_stack_ffffffffffffffa8;
  secp256k1_scalar *in_stack_ffffffffffffffb0;
  secp256k1_scalar local_38;
  uchar *local_18;
  uint local_4;
  
  iVar2 = 0;
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call((secp256k1_callback *)0x0,in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    secp256k1_scalar_set_b32(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int *)0x0);
    uVar1 = (uint)((iVar2 != 0 ^ 0xffU) & 1);
    memset(local_18,0,0x20);
    if (uVar1 != 0) {
      secp256k1_scalar_inverse(in_stack_00000170,in_stack_00000168);
      secp256k1_scalar_get_b32(local_18,(secp256k1_scalar *)&stack0xffffffffffffffa8);
      secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffffa8);
    }
    secp256k1_scalar_clear(&local_38);
    local_4 = uVar1;
  }
  return local_4;
}

Assistant:

int secp256k1_ec_privkey_tweak_inv(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    secp256k1_scalar inv;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    secp256k1_scalar_set_b32(&sec, seckey, &overflow);
    ret = !overflow;
    memset(seckey, 0, 32);
    if (ret) {
        secp256k1_scalar_inverse(&inv, &sec);
        secp256k1_scalar_get_b32(seckey, &inv);
        secp256k1_scalar_clear(&inv);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}